

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O3

void * xmlFileOpen_real(char *filename)

{
  int iVar1;
  long lVar2;
  FILE *pFVar3;
  char *__file;
  stat stat_buffer;
  stat64 local_a0;
  
  if (filename != (char *)0x0) {
    if ((*filename == '-') && (filename[1] == '\0')) {
      return _stdin;
    }
    iVar1 = xmlStrncasecmp((xmlChar *)filename,(xmlChar *)"file://localhost/",0x11);
    if (iVar1 == 0) {
      lVar2 = 0x10;
    }
    else {
      iVar1 = xmlStrncasecmp((xmlChar *)filename,(xmlChar *)"file:///",8);
      if (iVar1 == 0) {
        lVar2 = 7;
      }
      else {
        iVar1 = xmlStrncasecmp((xmlChar *)filename,(xmlChar *)"file:/",6);
        lVar2 = (ulong)(iVar1 == 0) * 5;
      }
    }
    __file = filename + lVar2;
    iVar1 = stat64(__file,&local_a0);
    if (iVar1 != -1) {
      pFVar3 = fopen64(__file,"rb");
      if (pFVar3 != (FILE *)0x0) {
        return pFVar3;
      }
      __xmlIOErr(8,0,__file);
      return (void *)0x0;
    }
  }
  return (void *)0x0;
}

Assistant:

static void *
xmlFileOpen_real (const char *filename) {
    const char *path = filename;
    FILE *fd;

    if (filename == NULL)
        return(NULL);

    if (!strcmp(filename, "-")) {
	fd = stdin;
	return((void *) fd);
    }

    if (!xmlStrncasecmp(BAD_CAST filename, BAD_CAST "file://localhost/", 17)) {
#if defined (_WIN32)
	path = &filename[17];
#else
	path = &filename[16];
#endif
    } else if (!xmlStrncasecmp(BAD_CAST filename, BAD_CAST "file:///", 8)) {
#if defined (_WIN32)
	path = &filename[8];
#else
	path = &filename[7];
#endif
    } else if (!xmlStrncasecmp(BAD_CAST filename, BAD_CAST "file:/", 6)) {
        /* lots of generators seems to lazy to read RFC 1738 */
#if defined (_WIN32)
	path = &filename[6];
#else
	path = &filename[5];
#endif
    }

    /* Do not check DDNAME on zOS ! */
#if !defined(__MVS__)
    if (!xmlCheckFilename(path))
        return(NULL);
#endif

#if defined(_WIN32)
    fd = xmlWrapOpenUtf8(path, 0);
#else
    fd = fopen(path, "rb");
#endif /* WIN32 */
    if (fd == NULL) xmlIOErr(0, path);
    return((void *) fd);
}